

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5StructureWrite(Fts5Index *p,Fts5Structure *pStruct)

{
  int *pRc;
  uint uVar1;
  uint uVar2;
  u8 *puVar3;
  Fts5StructureLevel *pFVar4;
  Fts5StructureLevel *pFVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Fts5Buffer buf;
  Fts5Buffer local_58;
  Fts5StructureLevel *local_48;
  Fts5Index *local_40;
  Fts5Structure *local_38;
  
  if (p->rc != 0) {
    return;
  }
  pRc = &p->rc;
  local_58.p = (u8 *)0x0;
  local_58.n = 0;
  local_58.nSpace = 0;
  uVar1 = p->pConfig->iCookie;
  local_40 = p;
  iVar6 = sqlite3Fts5BufferSize(pRc,&local_58,0x1f);
  puVar3 = local_58.p;
  if (iVar6 == 0) {
    uVar2 = 0;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    *(uint *)local_58.p =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    local_58.n = 4;
    iVar6 = sqlite3Fts5PutVarint((uchar *)((long)local_58.p + 4),(long)pStruct->nLevel);
    local_58.n = iVar6 + 4;
    iVar7 = sqlite3Fts5PutVarint((uchar *)((long)puVar3 + (long)iVar6 + 4),(long)pStruct->nSegment);
    iVar6 = iVar7 + iVar6 + 4;
    local_58.n = iVar6;
    iVar7 = sqlite3Fts5PutVarint((uchar *)((long)puVar3 + (long)iVar6),pStruct->nWriteCounter);
    local_58.n = iVar6 + iVar7;
  }
  if (0 < pStruct->nLevel) {
    local_48 = pStruct->aLevel;
    lVar8 = 0;
    local_38 = pStruct;
    do {
      pFVar4 = local_48;
      sqlite3Fts5BufferAppendVarint(pRc,&local_58,(long)local_48[lVar8].nMerge);
      sqlite3Fts5BufferAppendVarint(pRc,&local_58,(long)pFVar4[lVar8].nSeg);
      pFVar5 = local_48;
      if (0 < pFVar4[lVar8].nSeg) {
        lVar10 = 0;
        lVar9 = 0;
        do {
          sqlite3Fts5BufferAppendVarint
                    (pRc,&local_58,(long)*(int *)((long)&(pFVar5[lVar8].aSeg)->iSegid + lVar10));
          sqlite3Fts5BufferAppendVarint
                    (pRc,&local_58,(long)*(int *)((long)&(pFVar5[lVar8].aSeg)->pgnoFirst + lVar10));
          sqlite3Fts5BufferAppendVarint
                    (pRc,&local_58,(long)*(int *)((long)&(pFVar5[lVar8].aSeg)->pgnoLast + lVar10));
          lVar9 = lVar9 + 1;
          lVar10 = lVar10 + 0xc;
        } while (lVar9 < pFVar5[lVar8].nSeg);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_38->nLevel);
  }
  puVar3 = local_58.p;
  fts5DataWrite(local_40,10,local_58.p,local_58.n);
  sqlite3_free(puVar3);
  return;
}

Assistant:

static void fts5StructureWrite(Fts5Index *p, Fts5Structure *pStruct){
  if( p->rc==SQLITE_OK ){
    Fts5Buffer buf;               /* Buffer to serialize record into */
    int iLvl;                     /* Used to iterate through levels */
    int iCookie;                  /* Cookie value to store */

    assert( pStruct->nSegment==fts5StructureCountSegments(pStruct) );
    memset(&buf, 0, sizeof(Fts5Buffer));

    /* Append the current configuration cookie */
    iCookie = p->pConfig->iCookie;
    if( iCookie<0 ) iCookie = 0;

    if( 0==sqlite3Fts5BufferSize(&p->rc, &buf, 4+9+9+9) ){
      sqlite3Fts5Put32(buf.p, iCookie);
      buf.n = 4;
      fts5BufferSafeAppendVarint(&buf, pStruct->nLevel);
      fts5BufferSafeAppendVarint(&buf, pStruct->nSegment);
      fts5BufferSafeAppendVarint(&buf, (i64)pStruct->nWriteCounter);
    }

    for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
      int iSeg;                     /* Used to iterate through segments */
      Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
      fts5BufferAppendVarint(&p->rc, &buf, pLvl->nMerge);
      fts5BufferAppendVarint(&p->rc, &buf, pLvl->nSeg);
      assert( pLvl->nMerge<=pLvl->nSeg );

      for(iSeg=0; iSeg<pLvl->nSeg; iSeg++){
        fts5BufferAppendVarint(&p->rc, &buf, pLvl->aSeg[iSeg].iSegid);
        fts5BufferAppendVarint(&p->rc, &buf, pLvl->aSeg[iSeg].pgnoFirst);
        fts5BufferAppendVarint(&p->rc, &buf, pLvl->aSeg[iSeg].pgnoLast);
      }
    }

    fts5DataWrite(p, FTS5_STRUCTURE_ROWID, buf.p, buf.n);
    fts5BufferFree(&buf);
  }
}